

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

vector<void_*,_std::allocator<void_*>_> *
deqp::gles31::Functional::getInputOutputPointers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          *symbols,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,int numValues)

{
  undefined4 in_EAX;
  uint uVar1;
  int iVar2;
  vector<void_*,_std::allocator<void_*>_> *pvVar3;
  int iVar4;
  pointer pSVar5;
  long lVar6;
  long lVar7;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44(numValues,in_EAX);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)((long)&uStack_38 + 3));
  pSVar5 = (symbols->
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (int)((ulong)((long)(symbols->
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 3) *
          -0x49249249;
  pvVar3 = (vector<void_*,_std::allocator<void_*>_> *)(ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar6 = 0;
    lVar7 = 0x20;
    iVar4 = 0;
    do {
      iVar2 = glu::VarType::getScalarSize
                        ((VarType *)((long)&(pSVar5->name)._M_dataplus._M_p + lVar7));
      (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar6] =
           (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start + iVar4;
      iVar4 = iVar4 + iVar2 * local_34;
      lVar6 = lVar6 + 1;
      pSVar5 = (symbols->
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (vector<void_*,_std::allocator<void_*>_> *)
               (long)((int)((ulong)((long)(symbols->
                                          super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5
                                   ) >> 3) * -0x49249249);
      lVar7 = lVar7 + 0x38;
    } while (lVar6 < (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

static vector<void*> getInputOutputPointers (const vector<Symbol>& symbols, vector<deUint32>& data, const int numValues)
{
	vector<void*>	pointers		(symbols.size());
	int				curScalarOffset	= 0;

	for (int varNdx = 0; varNdx < (int)symbols.size(); ++varNdx)
	{
		const Symbol&	var				= symbols[varNdx];
		const int		scalarSize		= var.varType.getScalarSize();

		// Uses planar layout as input/output specs do not support strides.
		pointers[varNdx] = &data[curScalarOffset];
		curScalarOffset += scalarSize*numValues;
	}

	DE_ASSERT(curScalarOffset == (int)data.size());

	return pointers;
}